

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmprofiletocsv.cpp
# Opt level: O3

void fmprofiletocsv::doit(bool skipheader,bool step)

{
  double dVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  size_t sVar6;
  undefined7 in_register_00000031;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  fm_profile q;
  ulong local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  if ((int)CONCAT71(in_register_00000031,step) != 0) {
    dostep(skipheader);
    return;
  }
  if (!skipheader) {
    printf("profile_id,calcrule_id,deductible1,deductible2,");
    printf("deductible3,attachment1,limit1,share1,share2,");
    puts("share3");
  }
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_28 = 0;
  sVar6 = fread(&local_48,0x28,1,_stdin);
  uVar2 = uStack_40;
  uVar3 = local_38;
  uVar4 = uStack_30;
  uVar5 = local_28;
  while (sVar6 != 0) {
    uStack_40._0_4_ = (float)uVar2;
    dVar1 = (double)(float)uStack_40;
    uStack_40._4_4_ = (float)((ulong)uVar2 >> 0x20);
    dVar7 = (double)uStack_40._4_4_;
    local_38._0_4_ = (float)uVar3;
    dVar8 = (double)(float)local_38;
    local_38._4_4_ = (float)((ulong)uVar3 >> 0x20);
    dVar9 = (double)local_38._4_4_;
    uStack_30._0_4_ = (float)uVar4;
    dVar10 = (double)(float)uStack_30;
    uStack_30._4_4_ = (float)((ulong)uVar4 >> 0x20);
    dVar11 = (double)uStack_30._4_4_;
    local_28._0_4_ = (float)uVar5;
    dVar12 = (double)(float)local_28;
    local_28._4_4_ = (float)((ulong)uVar5 >> 0x20);
    dVar13 = (double)local_28._4_4_;
    uStack_40 = uVar2;
    local_38 = uVar3;
    uStack_30 = uVar4;
    local_28 = uVar5;
    printf("%d, %d, %f, %f, %f, %f, %f, %f, %f, %f\n",SUB84(dVar1,0),dVar7,dVar8,dVar9,dVar10,dVar11
           ,dVar12,dVar13,local_48 & 0xffffffff,local_48 >> 0x20);
    sVar6 = fread(&local_48,0x28,1,_stdin);
    uVar2 = uStack_40;
    uVar3 = local_38;
    uVar4 = uStack_30;
    uVar5 = local_28;
  }
  return;
}

Assistant:

void doit(bool skipheader, bool step) {
		if (step) {
			dostep(skipheader);
			return;
		}
        if (skipheader == false) {
            printf("profile_id,calcrule_id,deductible1,deductible2,");
            printf("deductible3,attachment1,limit1,share1,share2,");
            printf("share3\n");
        }

        fm_profile q;
        size_t i = fread(&q, sizeof(q), 1, stdin);
        while (i != 0) {
            printf("%d, %d, %f, %f, %f, %f, %f, %f, %f, %f\n", q.profile_id,
                   q.calcrule_id, q.deductible1, q.deductible2, q.deductible3,
                   q.attachment, q.limit, q.share1, q.share2, q.share3);

            i = fread(&q, sizeof(q), 1, stdin);
        }
    }